

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

Host * __thiscall Jupiter::HTTP::Server::Data::find_host(Data *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  Data *pDVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  reference this_00;
  pointer pHVar5;
  __sv_type __y;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  *__range1;
  uint name_checksum;
  Data *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Data *)name._M_len;
  uVar4 = calc_checksumi<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __end1 = std::
           vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ::begin(&this->m_hosts);
  host = (unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
          *)std::
            vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
            ::end(&this->m_hosts);
  do {
    bVar3 = __gnu_cxx::
            operator==<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
                                *)&host);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return (Host *)0x0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
              ::operator*(&__end1);
    pHVar5 = std::
             unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ::operator->(this_00);
    sVar2 = name_local._M_len;
    pDVar1 = this_local;
    if (uVar4 == (pHVar5->super_Directory).name_checksum) {
      pHVar5 = std::
               unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               ::operator->(this_00);
      __y = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&(pHVar5->super_Directory).name);
      __x._M_str = (char *)sVar2;
      __x._M_len = (size_t)pDVar1;
      bVar3 = std::operator==(__x,__y);
      if (bVar3) {
        pHVar5 = std::
                 unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                 ::get(this_00);
        return pHVar5;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Jupiter::HTTP::Server::Host *Jupiter::HTTP::Server::Data::find_host(std::string_view name) {
	unsigned int name_checksum = calc_checksumi(name);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && host->name == name) {
			return host.get();
		}
	}

	return nullptr;
}